

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hud.cpp
# Opt level: O0

void __thiscall CHud::RenderConnectionWarning(CHud *this)

{
  uint uVar1;
  int iVar2;
  IClient *pIVar3;
  char *pcVar4;
  ITextRender *pIVar5;
  int64 in_RDI;
  CTextCursor *unaff_retaddr;
  char *pText;
  CTextCursor *in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  char *in_stack_fffffffffffffff0;
  int64 iVar6;
  
  iVar6 = in_RDI;
  pIVar3 = CComponent::Client((CComponent *)0x16716b);
  uVar1 = (*(pIVar3->super_IInterface)._vptr_IInterface[0x28])();
  if ((uVar1 & 1) != 0) {
    pcVar4 = Localize(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
    if ((RenderConnectionWarning()::s_Cursor == '\0') &&
       (iVar2 = __cxa_guard_acquire(&RenderConnectionWarning()::s_Cursor), iVar2 != 0)) {
      CTextCursor::CTextCursor(unaff_retaddr,(float)((ulong)iVar6 >> 0x20),(int)iVar6);
      __cxa_atexit(CTextCursor::~CTextCursor,&RenderConnectionWarning::s_Cursor,&__dso_handle);
      __cxa_guard_release(&RenderConnectionWarning()::s_Cursor);
    }
    CComponent::Graphics((CComponent *)0x1671f9);
    IGraphics::ScreenAspect((IGraphics *)in_stack_ffffffffffffffe0);
    CTextCursor::MoveTo(in_stack_ffffffffffffffe0,(float)((ulong)in_RDI >> 0x20),(float)in_RDI);
    RenderConnectionWarning::s_Cursor.m_Align = 1;
    CLocalizationDatabase::Version(&g_Localization);
    CTextCursor::Reset(in_stack_ffffffffffffffe0,in_RDI);
    pIVar5 = CComponent::TextRender((CComponent *)0x167252);
    (*(pIVar5->super_IInterface)._vptr_IInterface[0xb])
              (pIVar5,&RenderConnectionWarning::s_Cursor,pcVar4,0xffffffff);
  }
  return;
}

Assistant:

void CHud::RenderConnectionWarning()
{
	if(Client()->ConnectionProblems())
	{
		const char *pText = Localize("Connection Problems...");
		static CTextCursor s_Cursor(24.0f);
		s_Cursor.MoveTo(150*Graphics()->ScreenAspect(), 50.0f);
		s_Cursor.m_Align = TEXTALIGN_TC;
		s_Cursor.Reset(g_Localization.Version());
		TextRender()->TextOutlined(&s_Cursor, pText, -1);
	}
}